

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O2

void __thiscall
CNscContext::AddStructure
          (CNscContext *this,char *pszIdentifier,uchar *pauchStructData,size_t nStructDataSize)

{
  CNscSymbolTable *this_00;
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  NscSymbol *pNVar4;
  size_t sVar5;
  long *plVar6;
  size_t sVar7;
  size_t nSymbol;
  int local_38;
  int local_34;
  
  uVar1 = this->m_nStructs;
  if ((int)uVar1 < 0x80) {
    this_00 = &this->m_sSymbols;
    pNVar4 = CNscSymbolTable::Add(this_00,pszIdentifier,NscSymType_Structure);
    (pNVar4->field_6).field_0.nToken = uVar1 + 0x20;
    (pNVar4->field_6).field_0.nEngineObject = 0;
    (pNVar4->field_6).field_2.nStackOffset = 0;
    sVar7 = (long)pNVar4 - (long)(this->m_sSymbols).m_pauchData;
    local_34 = 0;
    local_38 = 0;
    nSymbol = sVar7;
    for (plVar6 = (long *)pauchStructData; plVar6 < pauchStructData + nStructDataSize;
        plVar6 = (long *)((long)plVar6 + *plVar6)) {
      local_38 = local_38 + 1;
      iVar3 = GetTypeSize(this,*(NscType *)((long)plVar6 + 0xc));
      local_34 = local_34 + iVar3;
    }
    sVar5 = CNscSymbolTable::AppendData(this_00,&local_38,8);
    CNscSymbolTable::AppendData(this_00,pauchStructData,nStructDataSize);
    puVar2 = (this->m_sSymbols).m_pauchData;
    *(size_t *)(puVar2 + sVar7 + 0x28) = sVar5;
    pNVar4 = (NscSymbol *)(puVar2 + sVar7);
    if (this->m_fCompilingIntrinsic == false) {
      if (this->m_fNWScript == false) {
        iVar3 = this->m_pStreamTop->nFile;
      }
      else {
        iVar3 = -1;
      }
    }
    else {
      iVar3 = -2;
    }
    pNVar4->nFile = iVar3;
    pNVar4->nLine = this->m_pStreamTop->nLine;
    iVar3 = this->m_nStructs;
    this->m_nStructs = iVar3 + 1;
    this->m_anStructSymbol[iVar3] = sVar7;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->m_anGlobalDefs,&nSymbol);
    MarkGlobalIdentifierSymbol(this,pNVar4);
    return;
  }
  GenerateMessage(this,NscMessage_ErrorTooManyStructures,(ulong)uVar1);
  return;
}

Assistant:

void CNscContext::AddStructure (const char *pszIdentifier, 
	unsigned char *pauchStructData, size_t nStructDataSize)
{

	//
	// Make sure we still have room
	//

	if (m_nStructs >= Max_Structs)
	{
		GenerateMessage (NscMessage_ErrorTooManyStructures, m_nStructs);
		return;
	}

	//
	// Add a new symbol
	//

	NscType nType = (NscType) (NscType_Struct_0 + m_nStructs);
	NscSymbol *pSymbol = m_sSymbols .Add (
		pszIdentifier, NscSymType_Structure);
	pSymbol ->nType = nType;
	pSymbol ->ulFlags = 0;
	pSymbol ->nStackOffset = 0;
	size_t nSymbol = m_sSymbols .GetSymbolOffset (pSymbol);

	//
	// Count the number of elements
	//

	NscSymbolStructExtra sExtra;
	sExtra .nElementCount = 0;
	sExtra .nTotalSize = 0;
	unsigned char *pauchData = pauchStructData;
	unsigned char *pauchEnd = &pauchData [nStructDataSize];
	while (pauchData < pauchEnd)
	{
		NscPCodeHeader *p = (NscPCodeHeader *) pauchData;
		sExtra .nElementCount++;
		sExtra .nTotalSize += GetTypeSize (p ->nType);
		pauchData += p ->nOpSize;
	}

	//
	// Add the symbol data
	//

	size_t nExtra = m_sSymbols .AppendData (&sExtra, sizeof (sExtra));
	m_sSymbols .AppendData (pauchStructData, nStructDataSize);

	//
	// Save the data
	//

	pSymbol = m_sSymbols .GetSymbol (nSymbol);
	pSymbol ->nExtra = nExtra;
	pSymbol ->nFile = GetCurrentSourceFile ();
	pSymbol ->nLine = GetCurrentLine ();

	//
	// Save the symbol offset
	//

	m_anStructSymbol [m_nStructs++] = nSymbol;
	m_anGlobalDefs .push_back (nSymbol);
	MarkGlobalIdentifierSymbol (pSymbol);
}